

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void update_dyn_p(void)

{
  byte bVar1;
  byte bVar2;
  
  dyn_p = (result_f & 0x80) + 0x20;
  if (ovr_f != '\0') {
    dyn_p = result_f & 0x80 | 0x60;
  }
  if (brk_f != '\0') {
    dyn_p = dyn_p | 0x10;
  }
  if (dec_f != '\0') {
    dyn_p = dyn_p | 8;
  }
  bVar2 = dyn_p | 4;
  if (intd_f == '\0') {
    bVar2 = dyn_p;
  }
  bVar1 = bVar2 | 2;
  if (result_f != '\0') {
    bVar1 = bVar2;
  }
  if (result_f == '\0' || intd_f != '\0') {
    dyn_p = bVar1;
  }
  if (carry_f != '\0') {
    bVar1 = bVar1 | 1;
    dyn_p = bVar1;
  }
  if (except != '\0') {
    dyn_p = bVar1 | 0x82;
  }
  return;
}

Assistant:

void update_dyn_p(void)        // build valid processor status byte
// for pushing
{
    dyn_p = 0x20;                    // bit 5 is always set in the status byte
    dyn_p |= (result_f & 0x80);        //
    if (ovr_f) dyn_p |= 0x40;        //
    if (brk_f) dyn_p |= 0x10;        //
    if (dec_f) dyn_p |= 0x08;        // set the relevant bit in the status byte
    if (intd_f) dyn_p |= 0x04;       // for each flag
    if (!result_f) dyn_p |= 0x02;       //
    if (carry_f) dyn_p |= 0x01;      //
    if (except) dyn_p |= 0x82;
}